

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISkin.cpp
# Opt level: O0

void __thiscall
irr::gui::CGUISkin::CGUISkin(CGUISkin *this,void **vtt,EGUI_SKIN_TYPE type,IVideoDriver *driver)

{
  string<wchar_t> *psVar1;
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined8 *in_RSI;
  IGUISkin *in_RDI;
  u32 i;
  bool local_131;
  wchar_t *c;
  string<wchar_t> *local_f8;
  uint local_ec;
  SColor local_e8;
  SColor local_e4;
  SColor local_e0;
  SColor local_dc;
  SColor local_d8;
  SColor local_d4;
  SColor local_d0;
  SColor local_cc;
  SColor local_c8;
  SColor local_c4;
  SColor local_c0;
  SColor local_bc;
  SColor local_b8;
  SColor local_b4;
  SColor local_b0;
  SColor local_ac;
  SColor local_a8;
  SColor local_a4;
  SColor local_a0;
  SColor local_9c;
  SColor local_98;
  SColor local_94;
  SColor local_90;
  SColor local_8c;
  SColor local_88;
  SColor local_84;
  SColor local_80;
  SColor local_7c;
  SColor local_78;
  SColor local_74;
  SColor local_70;
  SColor local_6c;
  SColor local_68;
  SColor local_64;
  SColor local_60;
  SColor local_5c;
  SColor local_58;
  SColor local_54;
  SColor local_50;
  SColor local_4c;
  SColor local_48;
  SColor local_44;
  SColor local_40;
  SColor local_3c;
  SColor local_38;
  SColor local_34;
  SColor local_30;
  SColor local_2c;
  SColor local_28;
  SColor local_24;
  undefined8 local_20;
  undefined4 local_14;
  
  local_20 = in_RCX;
  local_14 = in_EDX;
  IGUISkin::IGUISkin(in_RDI,(void **)(in_RSI + 1));
  in_RDI->_vptr_IGUISkin = (_func_int **)*in_RSI;
  *(undefined8 *)((long)&in_RDI->_vptr_IGUISkin + (long)in_RDI->_vptr_IGUISkin[-3]) = in_RSI[3];
  psVar1 = (string<wchar_t> *)&in_RDI->field_0x8;
  do {
    local_f8 = psVar1;
    video::SColor::SColor((SColor *)local_f8);
    psVar1 = (string<wchar_t> *)&local_f8->field_0x4;
  } while (&local_f8->field_0x4 != &in_RDI[3].field_0xc);
  *(undefined8 *)&in_RDI[10].field_0x10 = 0;
  c = (wchar_t *)&in_RDI[10].field_0x18;
  do {
    core::string<wchar_t>::string((string<wchar_t> *)0x3c7b1d);
    c = c + 8;
  } while (c != (wchar_t *)&in_RDI[0x12].field_0x18);
  *(undefined8 *)&in_RDI[0x12].field_0x18 = local_20;
  *(undefined4 *)((long)&in_RDI[0x13]._vptr_IGUISkin + 4) = local_14;
  if ((*(int *)((long)&in_RDI[0x13]._vptr_IGUISkin + 4) == 0) ||
     (*(int *)((long)&in_RDI[0x13]._vptr_IGUISkin + 4) == 1)) {
    video::SColor::SColor(&local_24,0x65,0x32,0x32,0x32);
    *(u32 *)&in_RDI->field_0x8 = local_24.color;
    video::SColor::SColor(&local_28,0x65,0x82,0x82,0x82);
    *(u32 *)&in_RDI->field_0xc = local_28.color;
    video::SColor::SColor(&local_2c,0x65,0xd2,0xd2,0xd2);
    *(u32 *)&in_RDI->field_0x10 = local_2c.color;
    video::SColor::SColor(&local_30,0x65,0xff,0xff,0xff);
    *(u32 *)&in_RDI->field_0x14 = local_30.color;
    video::SColor::SColor(&local_34,0x65,0xd2,0xd2,0xd2);
    *(u32 *)&in_RDI->field_0x18 = local_34.color;
    video::SColor::SColor(&local_38,0x65,0x10,0xe,0x73);
    *(u32 *)&in_RDI->field_0x1c = local_38.color;
    video::SColor::SColor(&local_3c,0xff,0xff,0xff,0xff);
    *(u32 *)&in_RDI[1]._vptr_IGUISkin = local_3c.color;
    video::SColor::SColor(&local_40,0x65,100,100,100);
    *(u32 *)((long)&in_RDI[1]._vptr_IGUISkin + 4) = local_40.color;
    video::SColor::SColor(&local_44,0xf0,10,10,10);
    *(u32 *)&in_RDI[1].field_0x8 = local_44.color;
    video::SColor::SColor(&local_48,0xf0,0x82,0x82,0x82);
    *(u32 *)&in_RDI[1].field_0xc = local_48.color;
    video::SColor::SColor(&local_4c,0x65,8,0x24,0x6b);
    *(u32 *)&in_RDI[1].field_0x10 = local_4c.color;
    video::SColor::SColor(&local_50,0xf0,0xff,0xff,0xff);
    *(u32 *)&in_RDI[1].field_0x14 = local_50.color;
    video::SColor::SColor(&local_54,0x65,0xa5,0xa5,0xa5);
    *(u32 *)&in_RDI[1].field_0x18 = local_54.color;
    video::SColor::SColor(&local_58,0xff,0x1e,0x1e,0x1e);
    *(u32 *)&in_RDI[1].field_0x1c = local_58.color;
    video::SColor::SColor(&local_5c,200,0,0,0);
    *(u32 *)&in_RDI[2]._vptr_IGUISkin = local_5c.color;
    video::SColor::SColor(&local_60,200,0xff,0xff,0xe1);
    *(u32 *)((long)&in_RDI[2]._vptr_IGUISkin + 4) = local_60.color;
    video::SColor::SColor(&local_64,0x65,0xe6,0xe6,0xe6);
    *(u32 *)&in_RDI[2].field_0x8 = local_64.color;
    video::SColor::SColor(&local_68,0x65,0xff,0xff,0xff);
    *(u32 *)&in_RDI[2].field_0xc = local_68.color;
    video::SColor::SColor(&local_6c,200,10,10,10);
    *(u32 *)&in_RDI[2].field_0x10 = local_6c.color;
    video::SColor::SColor(&local_70,200,0xff,0xff,0xff);
    *(u32 *)&in_RDI[2].field_0x14 = local_70.color;
    video::SColor::SColor(&local_74,200,8,0x24,0x6b);
    *(u32 *)&in_RDI[2].field_0x18 = local_74.color;
    video::SColor::SColor(&local_78,0xf0,100,100,100);
    *(u32 *)&in_RDI[2].field_0x1c = local_78.color;
    video::SColor::SColor(&local_7c,0xff,0xff,0xff,0xff);
    *(u32 *)&in_RDI[3]._vptr_IGUISkin = local_7c.color;
    video::SColor::SColor(&local_80,0xff,0x78,0x78,0x78);
    *(u32 *)((long)&in_RDI[3]._vptr_IGUISkin + 4) = local_80.color;
    video::SColor::SColor(&local_84,0xff,0xf0,0xf0,0xff);
    *(u32 *)&in_RDI[3].field_0x8 = local_84.color;
    *(undefined4 *)&in_RDI[3].field_0xc = 0xe;
    *(undefined4 *)&in_RDI[3].field_0x10 = 0x1e;
    *(undefined4 *)&in_RDI[3].field_0x14 = 0xf;
    *(undefined4 *)&in_RDI[3].field_0x18 = 0x12;
    *(undefined4 *)&in_RDI[3].field_0x1c = 500;
    *(undefined4 *)&in_RDI[4]._vptr_IGUISkin = 200;
    *(undefined4 *)((long)&in_RDI[4]._vptr_IGUISkin + 4) = 0x50;
    *(undefined4 *)&in_RDI[4].field_0x8 = 0x1e;
    *(undefined4 *)&in_RDI[4].field_0xc = 2;
    *(undefined4 *)&in_RDI[4].field_0x10 = 0;
    *(undefined4 *)&in_RDI[4].field_0x14 = 2;
    *(undefined4 *)&in_RDI[4].field_0x18 = 0;
  }
  else {
    video::SColor::SColor(&local_88,0x60767982);
    *(u32 *)&in_RDI->field_0x8 = local_88.color;
    video::SColor::SColor(&local_8c,0xc0cbd2d9);
    *(u32 *)&in_RDI->field_0x10 = local_8c.color;
    video::SColor::SColor(&local_90,0x50e4e8f1);
    *(u32 *)&in_RDI->field_0xc = local_90.color;
    video::SColor::SColor(&local_94,0x40c7ccdc);
    *(u32 *)&in_RDI->field_0x14 = local_94.color;
    video::SColor::SColor(&local_98,0x802e313a);
    *(u32 *)&in_RDI->field_0x18 = local_98.color;
    video::SColor::SColor(&local_9c,0x80404040);
    *(u32 *)&in_RDI->field_0x1c = local_9c.color;
    video::SColor::SColor(&local_a0,0xffd0d0d0);
    *(u32 *)&in_RDI[1]._vptr_IGUISkin = local_a0.color;
    video::SColor::SColor(&local_a4,0xc0646464);
    *(u32 *)((long)&in_RDI[1]._vptr_IGUISkin + 4) = local_a4.color;
    video::SColor::SColor(&local_a8,0xd0161616);
    *(u32 *)&in_RDI[1].field_0x8 = local_a8.color;
    video::SColor::SColor(&local_ac,0x3c141414);
    *(u32 *)&in_RDI[1].field_0xc = local_ac.color;
    video::SColor::SColor(&local_b0,0x6c606060);
    *(u32 *)&in_RDI[1].field_0x10 = local_b0.color;
    video::SColor::SColor(&local_b4,0xd0e0e0e0);
    *(u32 *)&in_RDI[1].field_0x14 = local_b4.color;
    video::SColor::SColor(&local_b8,0xf0a5a5a5);
    *(u32 *)&in_RDI[1].field_0x18 = local_b8.color;
    video::SColor::SColor(&local_bc,0xffd2d2d2);
    *(u32 *)&in_RDI[1].field_0x1c = local_bc.color;
    video::SColor::SColor(&local_c0,0xf00f2033);
    *(u32 *)&in_RDI[2]._vptr_IGUISkin = local_c0.color;
    video::SColor::SColor(&local_c4,0xc0cbd2d9);
    *(u32 *)((long)&in_RDI[2]._vptr_IGUISkin + 4) = local_c4.color;
    video::SColor::SColor(&local_c8,0xf0e0e0e0);
    *(u32 *)&in_RDI[2].field_0x8 = local_c8.color;
    video::SColor::SColor(&local_cc,0xf0f0f0f0);
    *(u32 *)&in_RDI[2].field_0xc = local_cc.color;
    video::SColor::SColor(&local_d0,0xd0161616);
    *(u32 *)&in_RDI[2].field_0x10 = local_d0.color;
    video::SColor::SColor(&local_d4,0xd0161616);
    *(u32 *)&in_RDI[2].field_0x14 = local_d4.color;
    video::SColor::SColor(&local_d8,0xd0606060);
    *(u32 *)&in_RDI[2].field_0x18 = local_d8.color;
    video::SColor::SColor(&local_dc,0x3c101010);
    *(u32 *)&in_RDI[2].field_0x1c = local_dc.color;
    video::SColor::SColor(&local_e0,0xf0ffffff);
    *(u32 *)&in_RDI[3]._vptr_IGUISkin = local_e0.color;
    video::SColor::SColor(&local_e4,0xf0cccccc);
    *(u32 *)((long)&in_RDI[3]._vptr_IGUISkin + 4) = local_e4.color;
    video::SColor::SColor(&local_e8,0xf0fffff0);
    *(u32 *)&in_RDI[3].field_0x8 = local_e8.color;
    *(undefined4 *)&in_RDI[3].field_0xc = 0xe;
    *(undefined4 *)&in_RDI[3].field_0x10 = 0x30;
    *(undefined4 *)&in_RDI[3].field_0x14 = 0xf;
    *(undefined4 *)&in_RDI[3].field_0x18 = 0x12;
    *(undefined4 *)&in_RDI[3].field_0x1c = 500;
    *(undefined4 *)&in_RDI[4]._vptr_IGUISkin = 200;
    *(undefined4 *)((long)&in_RDI[4]._vptr_IGUISkin + 4) = 0x50;
    *(undefined4 *)&in_RDI[4].field_0x8 = 0x1e;
    *(undefined4 *)&in_RDI[4].field_0xc = 3;
    *(undefined4 *)&in_RDI[4].field_0x10 = 2;
    *(undefined4 *)&in_RDI[4].field_0x14 = 3;
    *(undefined4 *)&in_RDI[4].field_0x18 = 2;
  }
  *(undefined4 *)&in_RDI[4].field_0x1c = 0xf;
  *(undefined4 *)&in_RDI[5]._vptr_IGUISkin = 0;
  *(undefined4 *)((long)&in_RDI[5]._vptr_IGUISkin + 4) = 500;
  *(undefined4 *)&in_RDI[5].field_0x8 = 0;
  *(undefined4 *)&in_RDI[5].field_0xc = 99999;
  *(undefined4 *)&in_RDI[5].field_0x10 = 1;
  *(undefined4 *)&in_RDI[5].field_0x14 = 1;
  *(undefined4 *)&in_RDI[5].field_0x18 = 0;
  *(undefined4 *)&in_RDI[5].field_0x1c = 2;
  *(undefined4 *)&in_RDI[6]._vptr_IGUISkin = 0;
  *(undefined4 *)((long)&in_RDI[6]._vptr_IGUISkin + 4) = 0;
  core::string<wchar_t>::operator=(local_f8,c);
  core::string<wchar_t>::operator=(local_f8,c);
  core::string<wchar_t>::operator=(local_f8,c);
  core::string<wchar_t>::operator=(local_f8,c);
  core::string<wchar_t>::operator=(local_f8,c);
  core::string<wchar_t>::operator=(local_f8,c);
  core::string<wchar_t>::operator=(local_f8,c);
  core::string<wchar_t>::operator=(local_f8,c);
  *(undefined4 *)&in_RDI[6].field_0x8 = 0xe1;
  *(undefined4 *)&in_RDI[6].field_0xc = 0xe2;
  *(undefined4 *)&in_RDI[6].field_0x10 = 0xe3;
  *(undefined4 *)&in_RDI[6].field_0x14 = 0xe4;
  *(undefined4 *)&in_RDI[6].field_0x1c = 0xe5;
  *(undefined4 *)&in_RDI[7]._vptr_IGUISkin = 0xe6;
  *(undefined4 *)((long)&in_RDI[7]._vptr_IGUISkin + 4) = 0xe7;
  *(undefined4 *)&in_RDI[7].field_0x8 = 0xe8;
  *(undefined4 *)&in_RDI[7].field_0xc = 0xe8;
  *(undefined4 *)&in_RDI[7].field_0x10 = 0xe9;
  *(undefined4 *)&in_RDI[7].field_0x14 = 0xea;
  *(undefined4 *)&in_RDI[7].field_0x18 = 0xeb;
  *(undefined4 *)&in_RDI[7].field_0x1c = 0xec;
  *(undefined4 *)&in_RDI[8]._vptr_IGUISkin = 0xed;
  *(undefined4 *)((long)&in_RDI[8]._vptr_IGUISkin + 4) = 0xee;
  *(undefined4 *)&in_RDI[8].field_0x8 = 0xef;
  *(undefined4 *)&in_RDI[8].field_0xc = 0xf0;
  *(undefined4 *)&in_RDI[8].field_0x10 = 0xf1;
  *(undefined4 *)&in_RDI[6].field_0x18 = 0xf2;
  *(undefined4 *)&in_RDI[8].field_0x14 = 0xf3;
  *(undefined4 *)&in_RDI[8].field_0x18 = 0xf4;
  *(undefined4 *)&in_RDI[8].field_0x1c = 0xf5;
  *(undefined4 *)&in_RDI[9]._vptr_IGUISkin = 0xf6;
  for (local_ec = 0; local_ec < 5; local_ec = local_ec + 1) {
    *(undefined8 *)(&in_RDI[9].field_0x8 + (ulong)local_ec * 8) = 0;
  }
  local_131 = true;
  if (*(int *)((long)&in_RDI[0x13]._vptr_IGUISkin + 4) != 1) {
    local_131 = *(int *)((long)&in_RDI[0x13]._vptr_IGUISkin + 4) == 2;
  }
  *(bool *)&in_RDI[0x13]._vptr_IGUISkin = local_131;
  return;
}

Assistant:

CGUISkin::CGUISkin(EGUI_SKIN_TYPE type, video::IVideoDriver *driver) :
		SpriteBank(0), Driver(driver), Type(type)
{
#ifdef _DEBUG
	setDebugName("CGUISkin");
#endif

	if ((Type == EGST_WINDOWS_CLASSIC) || (Type == EGST_WINDOWS_METALLIC)) {
		Colors[EGDC_3D_DARK_SHADOW] = video::SColor(101, 50, 50, 50);
		Colors[EGDC_3D_SHADOW] = video::SColor(101, 130, 130, 130);
		Colors[EGDC_3D_FACE] = video::SColor(101, 210, 210, 210);
		Colors[EGDC_3D_HIGH_LIGHT] = video::SColor(101, 255, 255, 255);
		Colors[EGDC_3D_LIGHT] = video::SColor(101, 210, 210, 210);
		Colors[EGDC_ACTIVE_BORDER] = video::SColor(101, 16, 14, 115);
		Colors[EGDC_ACTIVE_CAPTION] = video::SColor(255, 255, 255, 255);
		Colors[EGDC_APP_WORKSPACE] = video::SColor(101, 100, 100, 100);
		Colors[EGDC_BUTTON_TEXT] = video::SColor(240, 10, 10, 10);
		Colors[EGDC_GRAY_TEXT] = video::SColor(240, 130, 130, 130);
		Colors[EGDC_HIGH_LIGHT] = video::SColor(101, 8, 36, 107);
		Colors[EGDC_HIGH_LIGHT_TEXT] = video::SColor(240, 255, 255, 255);
		Colors[EGDC_INACTIVE_BORDER] = video::SColor(101, 165, 165, 165);
		Colors[EGDC_INACTIVE_CAPTION] = video::SColor(255, 30, 30, 30);
		Colors[EGDC_TOOLTIP] = video::SColor(200, 0, 0, 0);
		Colors[EGDC_TOOLTIP_BACKGROUND] = video::SColor(200, 255, 255, 225);
		Colors[EGDC_SCROLLBAR] = video::SColor(101, 230, 230, 230);
		Colors[EGDC_WINDOW] = video::SColor(101, 255, 255, 255);
		Colors[EGDC_WINDOW_SYMBOL] = video::SColor(200, 10, 10, 10);
		Colors[EGDC_ICON] = video::SColor(200, 255, 255, 255);
		Colors[EGDC_ICON_HIGH_LIGHT] = video::SColor(200, 8, 36, 107);
		Colors[EGDC_GRAY_WINDOW_SYMBOL] = video::SColor(240, 100, 100, 100);
		Colors[EGDC_EDITABLE] = video::SColor(255, 255, 255, 255);
		Colors[EGDC_GRAY_EDITABLE] = video::SColor(255, 120, 120, 120);
		Colors[EGDC_FOCUSED_EDITABLE] = video::SColor(255, 240, 240, 255);

		Sizes[EGDS_SCROLLBAR_SIZE] = 14;
		Sizes[EGDS_MENU_HEIGHT] = 30;
		Sizes[EGDS_WINDOW_BUTTON_WIDTH] = 15;
		Sizes[EGDS_CHECK_BOX_WIDTH] = 18;
		Sizes[EGDS_MESSAGE_BOX_WIDTH] = 500;
		Sizes[EGDS_MESSAGE_BOX_HEIGHT] = 200;
		Sizes[EGDS_BUTTON_WIDTH] = 80;
		Sizes[EGDS_BUTTON_HEIGHT] = 30;

		Sizes[EGDS_TEXT_DISTANCE_X] = 2;
		Sizes[EGDS_TEXT_DISTANCE_Y] = 0;

		Sizes[EGDS_TITLEBARTEXT_DISTANCE_X] = 2;
		Sizes[EGDS_TITLEBARTEXT_DISTANCE_Y] = 0;
	} else {
		// 0x80a6a8af
		Colors[EGDC_3D_DARK_SHADOW] = 0x60767982;
		// Colors[EGDC_3D_FACE]			=	0xc0c9ccd4;		// tab background
		Colors[EGDC_3D_FACE] = 0xc0cbd2d9;   // tab background
		Colors[EGDC_3D_SHADOW] = 0x50e4e8f1; // tab background, and left-top highlight
		Colors[EGDC_3D_HIGH_LIGHT] = 0x40c7ccdc;
		Colors[EGDC_3D_LIGHT] = 0x802e313a;
		Colors[EGDC_ACTIVE_BORDER] = 0x80404040; // window title
		Colors[EGDC_ACTIVE_CAPTION] = 0xffd0d0d0;
		Colors[EGDC_APP_WORKSPACE] = 0xc0646464; // unused
		Colors[EGDC_BUTTON_TEXT] = 0xd0161616;
		Colors[EGDC_GRAY_TEXT] = 0x3c141414;
		Colors[EGDC_HIGH_LIGHT] = 0x6c606060;
		Colors[EGDC_HIGH_LIGHT_TEXT] = 0xd0e0e0e0;
		Colors[EGDC_INACTIVE_BORDER] = 0xf0a5a5a5;
		Colors[EGDC_INACTIVE_CAPTION] = 0xffd2d2d2;
		Colors[EGDC_TOOLTIP] = 0xf00f2033;
		Colors[EGDC_TOOLTIP_BACKGROUND] = 0xc0cbd2d9;
		Colors[EGDC_SCROLLBAR] = 0xf0e0e0e0;
		Colors[EGDC_WINDOW] = 0xf0f0f0f0;
		Colors[EGDC_WINDOW_SYMBOL] = 0xd0161616;
		Colors[EGDC_ICON] = 0xd0161616;
		Colors[EGDC_ICON_HIGH_LIGHT] = 0xd0606060;
		Colors[EGDC_GRAY_WINDOW_SYMBOL] = 0x3c101010;
		Colors[EGDC_EDITABLE] = 0xf0ffffff;
		Colors[EGDC_GRAY_EDITABLE] = 0xf0cccccc;
		Colors[EGDC_FOCUSED_EDITABLE] = 0xf0fffff0;

		Sizes[EGDS_SCROLLBAR_SIZE] = 14;
		Sizes[EGDS_MENU_HEIGHT] = 48;
		Sizes[EGDS_WINDOW_BUTTON_WIDTH] = 15;
		Sizes[EGDS_CHECK_BOX_WIDTH] = 18;
		Sizes[EGDS_MESSAGE_BOX_WIDTH] = 500;
		Sizes[EGDS_MESSAGE_BOX_HEIGHT] = 200;
		Sizes[EGDS_BUTTON_WIDTH] = 80;
		Sizes[EGDS_BUTTON_HEIGHT] = 30;

		Sizes[EGDS_TEXT_DISTANCE_X] = 3;
		Sizes[EGDS_TEXT_DISTANCE_Y] = 2;

		Sizes[EGDS_TITLEBARTEXT_DISTANCE_X] = 3;
		Sizes[EGDS_TITLEBARTEXT_DISTANCE_Y] = 2;
	}

	Sizes[EGDS_MESSAGE_BOX_GAP_SPACE] = 15;
	Sizes[EGDS_MESSAGE_BOX_MIN_TEXT_WIDTH] = 0;
	Sizes[EGDS_MESSAGE_BOX_MAX_TEXT_WIDTH] = 500;
	Sizes[EGDS_MESSAGE_BOX_MIN_TEXT_HEIGHT] = 0;
	Sizes[EGDS_MESSAGE_BOX_MAX_TEXT_HEIGHT] = 99999;

	Sizes[EGDS_BUTTON_PRESSED_IMAGE_OFFSET_X] = 1;
	Sizes[EGDS_BUTTON_PRESSED_IMAGE_OFFSET_Y] = 1;
	Sizes[EGDS_BUTTON_PRESSED_TEXT_OFFSET_X] = 0;
	Sizes[EGDS_BUTTON_PRESSED_TEXT_OFFSET_Y] = 2;
	Sizes[EGDS_BUTTON_PRESSED_SPRITE_OFFSET_X] = 0;
	Sizes[EGDS_BUTTON_PRESSED_SPRITE_OFFSET_Y] = 0;

	Texts[EGDT_MSG_BOX_OK] = L"OK";
	Texts[EGDT_MSG_BOX_CANCEL] = L"Cancel";
	Texts[EGDT_MSG_BOX_YES] = L"Yes";
	Texts[EGDT_MSG_BOX_NO] = L"No";
	Texts[EGDT_WINDOW_CLOSE] = L"Close";
	Texts[EGDT_WINDOW_RESTORE] = L"Restore";
	Texts[EGDT_WINDOW_MINIMIZE] = L"Minimize";
	Texts[EGDT_WINDOW_MAXIMIZE] = L"Maximize";

	Icons[EGDI_WINDOW_MAXIMIZE] = 225;
	Icons[EGDI_WINDOW_RESTORE] = 226;
	Icons[EGDI_WINDOW_CLOSE] = 227;
	Icons[EGDI_WINDOW_MINIMIZE] = 228;
	Icons[EGDI_CURSOR_UP] = 229;
	Icons[EGDI_CURSOR_DOWN] = 230;
	Icons[EGDI_CURSOR_LEFT] = 231;
	Icons[EGDI_CURSOR_RIGHT] = 232;
	Icons[EGDI_MENU_MORE] = 232;
	Icons[EGDI_CHECK_BOX_CHECKED] = 233;
	Icons[EGDI_DROP_DOWN] = 234;
	Icons[EGDI_SMALL_CURSOR_UP] = 235;
	Icons[EGDI_SMALL_CURSOR_DOWN] = 236;
	Icons[EGDI_RADIO_BUTTON_CHECKED] = 237;
	Icons[EGDI_MORE_LEFT] = 238;
	Icons[EGDI_MORE_RIGHT] = 239;
	Icons[EGDI_MORE_UP] = 240;
	Icons[EGDI_MORE_DOWN] = 241;
	Icons[EGDI_WINDOW_RESIZE] = 242;
	Icons[EGDI_EXPAND] = 243;
	Icons[EGDI_COLLAPSE] = 244;

	Icons[EGDI_FILE] = 245;
	Icons[EGDI_DIRECTORY] = 246;

	for (u32 i = 0; i < EGDF_COUNT; ++i)
		Fonts[i] = 0;

	UseGradient = (Type == EGST_WINDOWS_METALLIC) || (Type == EGST_BURNING_SKIN);
}